

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BndryData.cpp
# Opt level: O0

void __thiscall amrex::BndryData::BndryData(BndryData *this)

{
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  *in_RDI;
  BndryRegister *unaff_retaddr;
  
  BndryRegister::BndryRegister(unaff_retaddr);
  (in_RDI->super_FabArrayBase)._vptr_FabArrayBase = (_func_int **)&PTR__BndryData_01805c28;
  LayoutData<amrex::Vector<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>,_std::allocator<amrex::Vector<amrex::BoundCond,_std::allocator<amrex::BoundCond>_>_>_>_>
  ::LayoutData(in_RDI);
  LayoutData<std::array<double,_6UL>_>::LayoutData((LayoutData<std::array<double,_6UL>_> *)in_RDI);
  Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_>::Vector
            ((Vector<amrex::MultiMask,_std::allocator<amrex::MultiMask>_> *)0x16a3689);
  Geometry::Geometry((Geometry *)in_RDI);
  in_RDI[0xb].super_FabArrayBase.n_grow.vect[0] = -1;
  *(undefined1 *)(in_RDI[0xb].super_FabArrayBase.n_grow.vect + 1) = 0;
  return;
}

Assistant:

BndryData::BndryData () noexcept
    :
    m_ncomp(-1), m_defined(false) {}